

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O2

int __thiscall irwincolor::Map::load(Map *this,string *file,string *name)

{
  string *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  reference pvVar10;
  size_type sVar11;
  unspecified_bool_type p_Var12;
  char_t *pcVar13;
  ostream *poVar14;
  undefined8 *puVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  xml_attribute local_318;
  Map *local_310;
  xml_attribute local_308;
  allocator<char> local_2f9;
  vector<float,_std::allocator<float>_> xrgb;
  vector<double,_std::allocator<double>_> tmp;
  xml_node point;
  xpath_node local_268;
  string ext;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idxc;
  
  pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  this_00 = &this->space;
  this->nanr = 0.0;
  this->nang = 0.0;
  this->nanb = 0.0;
  std::__cxx11::string::assign((char *)this_00);
  this->paraView = true;
  std::__cxx11::string::find_last_of((char *)file,0x135849);
  std::__cxx11::string::substr((ulong)&ext,(ulong)file);
  this_01 = &this->r;
  this_02 = &this->g;
  this_03 = &this->b;
  pdVar5 = &this->nanr;
  bVar7 = std::operator==(&ext,"xml");
  if (bVar7) {
    pugi::xml_document::xml_document((xml_document *)&idxc);
    iVar9 = loadXml(file,(xml_document *)&idxc);
    if (iVar9 == 0) {
      tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      pugi::xpath_node::xpath_node(&local_268);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                     "/ColorMaps/ColorMap[@name=\'",name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xrgb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                     "\']/Point");
      std::__cxx11::string::operator=((string *)&tmp,(string *)&xrgb);
      std::__cxx11::string::~string((string *)&xrgb);
      std::__cxx11::string::~string((string *)&point);
      local_268 = pugi::xml_node::select_node
                            ((xml_node *)&idxc,
                             (char_t *)
                             tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,(xpath_variable_set *)0x0);
      bVar7 = pugi::xpath_node::operator!(&local_268);
      if (bVar7) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = &PTR__exception_00153a48;
        __cxa_throw(puVar15,&XPathException::typeinfo,std::exception::~exception);
      }
      local_318._attr = (xml_attribute_struct *)pugi::xpath_node::node(&local_268);
      point = pugi::xml_node::parent((xml_node *)&local_318);
      xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pugi::xml_node::attribute(&point,"space");
      pugi::xml_attribute::value((xml_attribute *)&xrgb);
      std::__cxx11::string::assign((char *)this_00);
      point = pugi::xpath_node::node(&local_268);
      local_310 = (Map *)CONCAT44(local_310._4_4_,(uint)(iVar9 != 0));
      while (p_Var12 = pugi::xml_node::operator_cast_to_function_pointer(&point),
            p_Var12 != (unspecified_bool_type)0x0) {
        local_308 = pugi::xml_node::attribute(&point,"x");
        pcVar13 = pugi::xml_attribute::value(&local_308);
        std::__cxx11::string::string<std::allocator<char>>((string *)&xrgb,pcVar13,&local_2f9);
        local_318._attr = (xml_attribute_struct *)std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&this->x,(double *)&local_318);
        std::__cxx11::string::~string((string *)&xrgb);
        local_308 = pugi::xml_node::attribute(&point,"r");
        pcVar13 = pugi::xml_attribute::value(&local_308);
        std::__cxx11::string::string<std::allocator<char>>((string *)&xrgb,pcVar13,&local_2f9);
        local_318._attr = (xml_attribute_struct *)std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_01,(double *)&local_318);
        std::__cxx11::string::~string((string *)&xrgb);
        local_308 = pugi::xml_node::attribute(&point,"g");
        pcVar13 = pugi::xml_attribute::value(&local_308);
        std::__cxx11::string::string<std::allocator<char>>((string *)&xrgb,pcVar13,&local_2f9);
        local_318._attr = (xml_attribute_struct *)std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_02,(double *)&local_318);
        std::__cxx11::string::~string((string *)&xrgb);
        local_308 = pugi::xml_node::attribute(&point,"b");
        pcVar13 = pugi::xml_attribute::value(&local_308);
        std::__cxx11::string::string<std::allocator<char>>((string *)&xrgb,pcVar13,&local_2f9);
        local_318._attr = (xml_attribute_struct *)std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_03,(double *)&local_318);
        std::__cxx11::string::~string((string *)&xrgb);
        point = pugi::xml_node::next_sibling(&point,"Point");
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                     "/ColorMaps/ColorMap[@name=\'",name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xrgb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                     "\']/NaN");
      std::__cxx11::string::operator=((string *)&tmp,(string *)&xrgb);
      std::__cxx11::string::~string((string *)&xrgb);
      std::__cxx11::string::~string((string *)&point);
      local_268 = pugi::xml_node::select_node
                            ((xml_node *)&idxc,
                             (char_t *)
                             tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,(xpath_variable_set *)0x0);
      iVar9 = (int)local_310;
      bVar7 = pugi::xpath_node::operator!(&local_268);
      if (bVar7) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = &PTR__exception_00153a48;
        __cxa_throw(puVar15,&XPathException::typeinfo,std::exception::~exception);
      }
      point = pugi::xpath_node::node(&local_268);
      local_318 = pugi::xml_node::attribute(&point,"r");
      pcVar13 = pugi::xml_attribute::value(&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xrgb,pcVar13,(allocator<char> *)&local_308);
      dVar1 = std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
      *pdVar5 = dVar1;
      std::__cxx11::string::~string((string *)&xrgb);
      local_318 = pugi::xml_node::attribute(&point,"g");
      pcVar13 = pugi::xml_attribute::value(&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xrgb,pcVar13,(allocator<char> *)&local_308);
      dVar1 = std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
      this->nang = dVar1;
      std::__cxx11::string::~string((string *)&xrgb);
      local_318 = pugi::xml_node::attribute(&point,"b");
      pcVar13 = pugi::xml_attribute::value(&local_318);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xrgb,pcVar13,(allocator<char> *)&local_308);
      dVar1 = std::__cxx11::stod((string *)&xrgb,(size_t *)0x0);
      this->nanb = dVar1;
      std::__cxx11::string::~string((string *)&xrgb);
      bVar7 = true;
      std::__cxx11::string::~string((string *)&tmp);
    }
    else {
      bVar7 = false;
      iVar9 = 1;
    }
    pugi::xml_document::~xml_document((xml_document *)&idxc);
    if (bVar7) goto LAB_00106bed;
  }
  else {
    bVar7 = std::operator==(&ext,"json");
    if (bVar7) {
      std::ifstream::ifstream(&idxc,(string *)file,_S_in);
      local_310 = this;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&point,(nullptr_t)0x0);
      nlohmann::operator>>
                ((istream *)&idxc,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&point);
      std::ifstream::close();
      uVar16 = 1;
LAB_0010651f:
      uVar18 = (ulong)(uVar16 - 1);
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&point,uVar18);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"Name");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&tmp,name);
      bVar7 = nlohmann::operator!=
                        (pvVar10,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&tmp);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&tmp);
      if (bVar7) goto code_r0x00106567;
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&point,uVar18);
      this = local_310;
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"RGBPoints");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&xrgb,pvVar10);
      for (uVar16 = 0;
          (ulong)uVar16 <
          (ulong)((long)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 4) {
        tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(double)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar16];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->x,(double *)&tmp);
        tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(double)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar16 + 1];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,(double *)&tmp);
        tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(double)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar16 + 2];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_02,(double *)&tmp);
        tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(double)xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar16 + 3];
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_03,(double *)&tmp);
      }
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&point,uVar18);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"ColorSpace");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&tmp,pvVar10);
      std::__cxx11::string::operator=((string *)this_00,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&point,uVar18);
      bVar8 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[9],_0>(pvVar10,(char (*) [9])"NanColor");
      if (bVar8) {
        pvVar10 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&point,uVar18);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar10,"NanColor");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&tmp,pvVar10);
        dVar1 = (double)SUB84(*tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,0);
        dVar2 = (double)(float)((ulong)*tmp.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 0x20);
        auVar6._8_4_ = SUB84(dVar2,0);
        auVar6._0_8_ = dVar1;
        auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
        this->nanr = dVar1;
        this->nang = (double)auVar6._8_8_;
        this->nanb = (double)*(float *)(tmp.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_start + 1);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&tmp);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&xrgb.super__Vector_base<float,_std::allocator<float>_>);
      goto LAB_00106bc6;
    }
    poVar14 = std::operator<<((ostream *)&std::cout,"\nError:  unknown colormap file extension \".")
    ;
    poVar14 = std::operator<<(poVar14,(string *)&ext);
    poVar14 = std::operator<<(poVar14,"\".");
    std::endl<char,std::char_traits<char>>(poVar14);
    iVar9 = -6;
  }
  goto LAB_00106be6;
code_r0x00106567:
  uVar18 = (ulong)uVar16;
  sVar11 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&point);
  uVar16 = uVar16 + 1;
  if (sVar11 <= uVar18) goto LAB_00106579;
  goto LAB_0010651f;
LAB_00106579:
  poVar14 = std::operator<<((ostream *)&std::cout,"\nError:  cannot find colormap name \"");
  this = local_310;
  poVar14 = std::operator<<(poVar14,(string *)name);
  poVar14 = std::operator<<(poVar14,"\".");
  std::endl<char,std::char_traits<char>>(poVar14);
LAB_00106bc6:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&point);
  std::ifstream::~ifstream(&idxc);
  iVar9 = -2;
  if (!bVar7) {
LAB_00106bed:
    std::operator<<((ostream *)&std::cout,"NaN RGB = ");
    std::ostream::_M_insert<double>(*pdVar5);
    std::ostream::_M_insert<double>(this->nang);
    poVar14 = std::ostream::_M_insert<double>(this->nanb);
    std::operator<<(poVar14,"\n");
    poVar14 = std::operator<<((ostream *)&std::cout,"Colormap space = ");
    poVar14 = std::operator<<(poVar14,(string *)this_00);
    std::operator<<(poVar14,"\n");
    poVar14 = std::operator<<((ostream *)&std::cout,"Number of interpolation points = ");
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::operator<<(poVar14,"\n");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    sortidx<double>(&idxc,&this->x);
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::operator=(&tmp,&this->x);
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar17 = 0; (long)pdVar4 - (long)pdVar3 >> 3 != lVar17; lVar17 = lVar17 + 1) {
      pdVar3[lVar17] =
           tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[idxc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar17]];
    }
    std::vector<double,_std::allocator<double>_>::operator=(&tmp,this_01);
    pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar17 = 0; (long)pdVar4 - (long)pdVar3 >> 3 != lVar17; lVar17 = lVar17 + 1) {
      pdVar3[lVar17] =
           tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[idxc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar17]];
    }
    std::vector<double,_std::allocator<double>_>::operator=(&tmp,this_02);
    pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar17 = 0; (long)pdVar4 - (long)pdVar3 >> 3 != lVar17; lVar17 = lVar17 + 1) {
      pdVar3[lVar17] =
           tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[idxc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar17]];
    }
    std::vector<double,_std::allocator<double>_>::operator=(&tmp,this_03);
    pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar17 = 0; (long)pdVar4 - (long)pdVar3 >> 3 != lVar17; lVar17 = lVar17 + 1) {
      pdVar3[lVar17] =
           tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[idxc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar17]];
    }
    pdVar5 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar1 = *pdVar5;
    dVar2 = pdVar3[-1];
    for (lVar17 = 0; (long)pdVar3 - (long)pdVar5 >> 3 != lVar17; lVar17 = lVar17 + 1) {
      pdVar5[lVar17] = (pdVar5[lVar17] - dVar1) / (dVar2 - dVar1);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&tmp.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&idxc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    bVar7 = true;
    goto LAB_00106e41;
  }
LAB_00106be6:
  bVar7 = false;
LAB_00106e41:
  std::__cxx11::string::~string((string *)&ext);
  if (bVar7) {
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int load(std::string file, std::string name)
	{ try {
		x.clear();
		r.clear();
		g.clear();
		b.clear();
		nanr = 0;
		nang = 0;
		nanb = 0;
		space = "RGB";
		paraView = true;

		std::string ext = file.substr(file.find_last_of(".") + 1);
		if (ext == "xml")
		{
			pugi::xml_document doc;
			if (int io = loadXml(file, doc) != 0)
				return io;

			std::string xquery;
			pugi::xpath_node point0;
			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/Point";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				//std::cout << "point0 = " << point0.node().first_attribute().value() << "\n";
				space = point0.node().parent().attribute("space").value();
				for (pugi::xml_node point = point0.node(); point; point = point.next_sibling("Point"))
				{
					//std::cout << "b = " << point.attribute("b").value() << std::endl;
					x.push_back(std::stod(point.attribute("x").value()));
					r.push_back(std::stod(point.attribute("r").value()));
					g.push_back(std::stod(point.attribute("g").value()));
					b.push_back(std::stod(point.attribute("b").value()));
				}
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot parse colormap \"" << name << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_XML_PARSE;
			}

			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/NaN";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				pugi::xml_node nan = point0.node();
				nanr = std::stod(nan.attribute("r").value());
				nang = std::stod(nan.attribute("g").value());
				nanb = std::stod(nan.attribute("b").value());
			}
			catch (const std::exception& e)
			{
				// Do nothing.  Use default NaN color.
			}
		}
		else if (ext == "json")
		{
			std::ifstream ifs(file);
			json inj;

			try
			{
				ifs >> inj;
				ifs.close();  // close to release lock on file
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot load JSON colormap file \"" << file << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_JSON;
			}

			//std::cout << "Input JSON =\n" << std::setw(4) << inj << "\n" << std::endl;

			unsigned int i = 0;
			while (inj[i]["Name"] != name)
			{
				i++;
				if (i >= inj.size())
				{
					std::cout << "\nError:  cannot find colormap name \"" << name << "\"." << std::endl;
					return ERR_JSON;
				}
			}

			//std::string name0 = inj[i]["Name"];
			//std::cout << "name0 = " << name0 << std::endl;

			std::vector<float> xrgb = inj[i]["RGBPoints"];
			//std::cout << "xrgb = " << xrgb << std::endl;
			for (unsigned int j = 0; j < xrgb.size();)
			{
				x.push_back(xrgb[j++]);
				r.push_back(xrgb[j++]);
				g.push_back(xrgb[j++]);
				b.push_back(xrgb[j++]);
			}

			space = inj[i]["ColorSpace"];

			if (inj[i].contains("NanColor"))
			{
				//std::cout << "contains NanColor\n\n";

				try
				{
					std::vector<float> nan = inj[i]["NanColor"];
					nanr = nan[0];
					nang = nan[1];
					nanb = nan[2];
				}
				catch (const nlohmann::detail::type_error& e)
				{
				}
				catch (const std::exception& e)
				{
					// Do nothing.  Use default NaN color.
				}
			}
			//else
			//{
			//	std::cout << "does not contain NanColor\n\n";
			//}

		}
		else
		{
			std::cout << "\nError:  unknown colormap file extension \"." << ext << "\"." << std::endl;
			return ERR_FILETYPE;
		}

		std::cout << "NaN RGB = " << nanr << nang << nanb << "\n";
		std::cout << "Colormap space = " << space << "\n";
		std::cout << "Number of interpolation points = " << x.size() << "\n";
		std::cout << std::endl;

		// Sort by x.
		auto idxc = sortidx(x);
		std::vector<double> tmp;
		tmp = x;
		for (int i = 0; i < x.size(); i++)
			x[i] = tmp[idxc[i]];
		tmp = r;
		for (int i = 0; i < r.size(); i++)
			r[i] = tmp[idxc[i]];
		tmp = g;
		for (int i = 0; i < g.size(); i++)
			g[i] = tmp[idxc[i]];
		tmp = b;
		for (int i = 0; i < b.size(); i++)
			b[i] = tmp[idxc[i]];

		// Map x to range [0, 1], since some XMLs use [-1, 1] instead.
		auto cxmin = x[0];
		auto cxmax = x[x.size() - 1];
		for (int i = 0; i < x.size(); i++)
			x[i] = (x[i] - cxmin) / (cxmax - cxmin);

		//std::cout << "Color map:\n";
		//for (int i = 0; i < x.size(); i++)
		//{
		//	std::cout << "x = " << x[i] << ", r = " << r[i]
		//	        << ", g = " << g[i] << ", b = " << b[i] << "\n";
		//}

		}
		catch (const nlohmann::detail::type_error& e)
		{
		}
		catch (const std::exception& e)
		{
			// Do nothing.  Use default NaN color.
		}

		return 0;
	}